

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int parse_keyword(archive_read *a,mtree *mtree,archive_entry *entry,mtree_option *opt,
                 int *parsed_kws)

{
  char *__s1;
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long in_RCX;
  dev_t *pdev;
  archive_entry *in_RDX;
  long in_RSI;
  archive *in_RDI;
  uint *in_R8;
  long ns;
  int64_t my_time_t_min;
  int64_t my_time_t_max;
  int64_t m;
  dev_t dev_1;
  int r_1;
  dev_t dev;
  int r;
  char *key;
  char *val;
  char *in_stack_ffffffffffffff28;
  archive_entry *in_stack_ffffffffffffff30;
  mtree_entry *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  archive_string *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff68;
  archive *in_stack_ffffffffffffff70;
  long local_80;
  time_t local_68;
  dev_t local_60;
  dev_t local_50;
  char *local_38;
  uint *local_30;
  archive_entry *local_20;
  long local_18;
  
  __s1 = *(char **)(in_RCX + 8);
  if (*__s1 == '\0') {
    return 0;
  }
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = strcmp(__s1,"nochange");
  if (iVar1 == 0) {
    *local_30 = *local_30 | 0x1000;
    return 0;
  }
  iVar1 = strcmp(__s1,"optional");
  if (iVar1 == 0) {
    *local_30 = *local_30 | 0x800;
    return 0;
  }
  iVar1 = strcmp(__s1,"ignore");
  if (iVar1 == 0) {
    return 0;
  }
  local_38 = strchr(__s1,0x3d);
  if (local_38 == (char *)0x0) {
    archive_set_error(in_RDI,0x54,"Malformed attribute \"%s\" (%d)",__s1,(ulong)(uint)(int)*__s1);
    return -0x14;
  }
  *local_38 = '\0';
  local_38 = local_38 + 1;
  pdev = (dev_t *)(ulong)((int)*__s1 - 99);
  switch(pdev) {
  case (dev_t *)0x0:
    iVar1 = strcmp(__s1,"content");
    if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"contents"), iVar1 == 0)) {
      parse_escapes(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      *(undefined8 *)(local_18 + 0x70) = 0;
      if (local_38 != (char *)0x0) {
        strlen(local_38);
      }
      archive_strncat(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                      (size_t)in_stack_ffffffffffffff40);
      return 0;
    }
    iVar1 = strcmp(__s1,"cksum");
    if (iVar1 == 0) {
      return 0;
    }
  case (dev_t *)0x1:
    iVar1 = strcmp(__s1,"device");
    if (iVar1 == 0) {
      *local_30 = *local_30 | 1;
      iVar1 = parse_device(pdev,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (iVar1 == 0) {
        archive_entry_set_rdev(local_20,local_50);
        return 0;
      }
      return iVar1;
    }
  case (dev_t *)0x3:
    iVar1 = strcmp(__s1,"flags");
    if (iVar1 == 0) {
      *local_30 = *local_30 | 2;
      archive_entry_copy_fflags_text(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      return 0;
    }
  case (dev_t *)0x4:
    iVar1 = strcmp(__s1,"gid");
    if (iVar1 == 0) {
      *local_30 = *local_30 | 4;
      iVar3 = mtree_atol10(&local_38);
      archive_entry_set_gid(local_20,iVar3);
      return 0;
    }
    iVar1 = strcmp(__s1,"gname");
    if (iVar1 == 0) {
      *local_30 = *local_30 | 8;
      archive_entry_copy_gname(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      return 0;
    }
  case (dev_t *)0x6:
    iVar1 = strcmp(__s1,"inode");
    if (iVar1 == 0) {
      iVar3 = mtree_atol10(&local_38);
      archive_entry_set_ino(local_20,iVar3);
      return 0;
    }
  case (dev_t *)0x9:
    iVar1 = strcmp(__s1,"link");
    if (iVar1 == 0) {
      archive_entry_copy_symlink(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      return 0;
    }
  case (dev_t *)0xa:
    iVar1 = strcmp(__s1,"md5");
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = strcmp(__s1,"md5digest");
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = strcmp(__s1,"mode");
    if (iVar1 == 0) {
      if (('/' < *local_38) && (*local_38 < ':')) {
        *local_30 = *local_30 | 0x40;
        iVar3 = mtree_atol8(&local_38);
        archive_entry_set_perm(local_20,(mode_t)iVar3);
        return 0;
      }
      archive_set_error(in_RDI,0x54,"Symbolic mode \"%s\" unsupported",local_38);
      return -0x14;
    }
  case (dev_t *)0xb:
    iVar1 = strcmp(__s1,"nlink");
    if (iVar1 == 0) {
      *local_30 = *local_30 | 0x20;
      iVar3 = mtree_atol10(&local_38);
      archive_entry_set_nlink(local_20,(uint)iVar3);
      return 0;
    }
  case (dev_t *)0xf:
    iVar1 = strcmp(__s1,"resdevice");
    if (iVar1 == 0) {
      iVar1 = parse_device(pdev,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (iVar1 == 0) {
        archive_entry_set_dev(local_20,local_60);
        return 0;
      }
      return iVar1;
    }
    iVar1 = strcmp(__s1,"rmd160");
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = strcmp(__s1,"rmd160digest");
    if (iVar1 == 0) {
      return 0;
    }
    break;
  default:
switchD_00145045_caseD_2:
    archive_set_error(in_RDI,0x54,"Unrecognized key %s=%s",__s1,local_38);
    return -0x14;
  case (dev_t *)0x10:
    break;
  case (dev_t *)0x11:
    goto switchD_00145045_caseD_11;
  case (dev_t *)0x12:
    goto switchD_00145045_caseD_12;
  }
  iVar1 = strcmp(__s1,"sha1");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"sha1digest");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"sha256");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"sha256digest");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"sha384");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"sha384digest");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"sha512");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"sha512digest");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"size");
  if (iVar1 == 0) {
    iVar3 = mtree_atol10(&local_38);
    archive_entry_set_size(local_20,iVar3);
    return 0;
  }
switchD_00145045_caseD_11:
  iVar1 = strcmp(__s1,"tags");
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = strcmp(__s1,"time");
  if (iVar1 == 0) {
    local_68 = get_time_t_max();
    iVar3 = get_time_t_min();
    *local_30 = *local_30 | 0x10;
    iVar2 = mtree_atol10(&local_38);
    if (*local_38 == '.') {
      local_38 = local_38 + 1;
      local_80 = mtree_atol10(&local_38);
    }
    else {
      local_80 = 0;
    }
    if ((iVar2 <= local_68) && (local_68 = iVar2, iVar2 < iVar3)) {
      local_68 = iVar3;
    }
    archive_entry_set_mtime(local_20,local_68,local_80);
    return 0;
  }
  iVar1 = strcmp(__s1,"type");
  if (iVar1 != 0) {
switchD_00145045_caseD_12:
    iVar1 = strcmp(__s1,"uid");
    if (iVar1 == 0) {
      *local_30 = *local_30 | 0x200;
      iVar3 = mtree_atol10(&local_38);
      archive_entry_set_uid(local_20,iVar3);
      return 0;
    }
    iVar1 = strcmp(__s1,"uname");
    if (iVar1 == 0) {
      *local_30 = *local_30 | 0x400;
      archive_entry_copy_uname(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      return 0;
    }
    goto switchD_00145045_caseD_2;
  }
  switch(*local_38) {
  case 'b':
    iVar1 = strcmp(local_38,"block");
    if (iVar1 == 0) {
      archive_entry_set_filetype(local_20,0x6000);
      goto LAB_001458a4;
    }
    break;
  case 'c':
    break;
  case 'd':
    goto switchD_00145739_caseD_64;
  default:
    goto switchD_00145739_caseD_65;
  case 'f':
    goto switchD_00145739_caseD_66;
  case 'l':
    goto switchD_00145739_caseD_6c;
  }
  iVar1 = strcmp(local_38,"char");
  if (iVar1 == 0) {
    archive_entry_set_filetype(local_20,0x2000);
  }
  else {
switchD_00145739_caseD_64:
    iVar1 = strcmp(local_38,"dir");
    if (iVar1 == 0) {
      archive_entry_set_filetype(local_20,0x4000);
    }
    else {
switchD_00145739_caseD_66:
      iVar1 = strcmp(local_38,"fifo");
      if (iVar1 == 0) {
        archive_entry_set_filetype(local_20,0x1000);
      }
      else {
        iVar1 = strcmp(local_38,"file");
        if (iVar1 == 0) {
          archive_entry_set_filetype(local_20,0x8000);
        }
        else {
switchD_00145739_caseD_6c:
          iVar1 = strcmp(local_38,"link");
          if (iVar1 != 0) {
switchD_00145739_caseD_65:
            archive_set_error(in_RDI,0x54,"Unrecognized file type \"%s\"; assuming \"file\"",
                              local_38);
            archive_entry_set_filetype(local_20,0x8000);
            return -0x14;
          }
          archive_entry_set_filetype(local_20,0xa000);
        }
      }
    }
  }
LAB_001458a4:
  *local_30 = *local_30 | 0x100;
  return 0;
}

Assistant:

static int
parse_keyword(struct archive_read *a, struct mtree *mtree,
    struct archive_entry *entry, struct mtree_option *opt, int *parsed_kws)
{
	char *val, *key;

	key = opt->value;

	if (*key == '\0')
		return (ARCHIVE_OK);

	if (strcmp(key, "nochange") == 0) {
		*parsed_kws |= MTREE_HAS_NOCHANGE;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "optional") == 0) {
		*parsed_kws |= MTREE_HAS_OPTIONAL;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "ignore") == 0) {
		/*
		 * The mtree processing is not recursive, so
		 * recursion will only happen for explicitly listed
		 * entries.
		 */
		return (ARCHIVE_OK);
	}

	val = strchr(key, '=');
	if (val == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Malformed attribute \"%s\" (%d)", key, key[0]);
		return (ARCHIVE_WARN);
	}

	*val = '\0';
	++val;

	switch (key[0]) {
	case 'c':
		if (strcmp(key, "content") == 0
		    || strcmp(key, "contents") == 0) {
			parse_escapes(val, NULL);
			archive_strcpy(&mtree->contents_name, val);
			break;
		}
		if (strcmp(key, "cksum") == 0)
			break;
	case 'd':
		if (strcmp(key, "device") == 0) {
			/* stat(2) st_rdev field, e.g. the major/minor IDs
			 * of a char/block special file */
			int r;
			dev_t dev;

			*parsed_kws |= MTREE_HAS_DEVICE;
			r = parse_device(&dev, &a->archive, val);
			if (r == ARCHIVE_OK)
				archive_entry_set_rdev(entry, dev);
			return r;
		}
	case 'f':
		if (strcmp(key, "flags") == 0) {
			*parsed_kws |= MTREE_HAS_FFLAGS;
			archive_entry_copy_fflags_text(entry, val);
			break;
		}
	case 'g':
		if (strcmp(key, "gid") == 0) {
			*parsed_kws |= MTREE_HAS_GID;
			archive_entry_set_gid(entry, mtree_atol10(&val));
			break;
		}
		if (strcmp(key, "gname") == 0) {
			*parsed_kws |= MTREE_HAS_GNAME;
			archive_entry_copy_gname(entry, val);
			break;
		}
	case 'i':
		if (strcmp(key, "inode") == 0) {
			archive_entry_set_ino(entry, mtree_atol10(&val));
			break;
		}
	case 'l':
		if (strcmp(key, "link") == 0) {
			archive_entry_copy_symlink(entry, val);
			break;
		}
	case 'm':
		if (strcmp(key, "md5") == 0 || strcmp(key, "md5digest") == 0)
			break;
		if (strcmp(key, "mode") == 0) {
			if (val[0] >= '0' && val[0] <= '9') {
				*parsed_kws |= MTREE_HAS_PERM;
				archive_entry_set_perm(entry,
				    (mode_t)mtree_atol8(&val));
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Symbolic mode \"%s\" unsupported", val);
				return ARCHIVE_WARN;
			}
			break;
		}
	case 'n':
		if (strcmp(key, "nlink") == 0) {
			*parsed_kws |= MTREE_HAS_NLINK;
			archive_entry_set_nlink(entry,
				(unsigned int)mtree_atol10(&val));
			break;
		}
	case 'r':
		if (strcmp(key, "resdevice") == 0) {
			/* stat(2) st_dev field, e.g. the device ID where the
			 * inode resides */
			int r;
			dev_t dev;

			r = parse_device(&dev, &a->archive, val);
			if (r == ARCHIVE_OK)
				archive_entry_set_dev(entry, dev);
			return r;
		}
		if (strcmp(key, "rmd160") == 0 ||
		    strcmp(key, "rmd160digest") == 0)
			break;
	case 's':
		if (strcmp(key, "sha1") == 0 || strcmp(key, "sha1digest") == 0)
			break;
		if (strcmp(key, "sha256") == 0 ||
		    strcmp(key, "sha256digest") == 0)
			break;
		if (strcmp(key, "sha384") == 0 ||
		    strcmp(key, "sha384digest") == 0)
			break;
		if (strcmp(key, "sha512") == 0 ||
		    strcmp(key, "sha512digest") == 0)
			break;
		if (strcmp(key, "size") == 0) {
			archive_entry_set_size(entry, mtree_atol10(&val));
			break;
		}
	case 't':
		if (strcmp(key, "tags") == 0) {
			/*
			 * Comma delimited list of tags.
			 * Ignore the tags for now, but the interface
			 * should be extended to allow inclusion/exclusion.
			 */
			break;
		}
		if (strcmp(key, "time") == 0) {
			int64_t m;
			int64_t my_time_t_max = get_time_t_max();
			int64_t my_time_t_min = get_time_t_min();
			long ns;

			*parsed_kws |= MTREE_HAS_MTIME;
			m = mtree_atol10(&val);
			/* Replicate an old mtree bug:
			 * 123456789.1 represents 123456789
			 * seconds and 1 nanosecond. */
			if (*val == '.') {
				++val;
				ns = (long)mtree_atol10(&val);
			} else
				ns = 0;
			if (m > my_time_t_max)
				m = my_time_t_max;
			else if (m < my_time_t_min)
				m = my_time_t_min;
			archive_entry_set_mtime(entry, (time_t)m, ns);
			break;
		}
		if (strcmp(key, "type") == 0) {
			switch (val[0]) {
			case 'b':
				if (strcmp(val, "block") == 0) {
					archive_entry_set_filetype(entry, AE_IFBLK);
					break;
				}
			case 'c':
				if (strcmp(val, "char") == 0) {
					archive_entry_set_filetype(entry, AE_IFCHR);
					break;
				}
			case 'd':
				if (strcmp(val, "dir") == 0) {
					archive_entry_set_filetype(entry, AE_IFDIR);
					break;
				}
			case 'f':
				if (strcmp(val, "fifo") == 0) {
					archive_entry_set_filetype(entry, AE_IFIFO);
					break;
				}
				if (strcmp(val, "file") == 0) {
					archive_entry_set_filetype(entry, AE_IFREG);
					break;
				}
			case 'l':
				if (strcmp(val, "link") == 0) {
					archive_entry_set_filetype(entry, AE_IFLNK);
					break;
				}
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Unrecognized file type \"%s\"; assuming \"file\"", val);
				archive_entry_set_filetype(entry, AE_IFREG);
				return (ARCHIVE_WARN);
			}
			*parsed_kws |= MTREE_HAS_TYPE;
			break;
		}
	case 'u':
		if (strcmp(key, "uid") == 0) {
			*parsed_kws |= MTREE_HAS_UID;
			archive_entry_set_uid(entry, mtree_atol10(&val));
			break;
		}
		if (strcmp(key, "uname") == 0) {
			*parsed_kws |= MTREE_HAS_UNAME;
			archive_entry_copy_uname(entry, val);
			break;
		}
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unrecognized key %s=%s", key, val);
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}